

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O0

char * blogc_htmlentities(char *str)

{
  bc_string_t *str_00;
  long local_28;
  size_t i;
  bc_string_t *rv;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    str_00 = bc_string_new();
    for (local_28 = 0; str[local_28] != '\0'; local_28 = local_28 + 1) {
      htmlentities_append(str_00,str[local_28]);
    }
    str_local = bc_string_free(str_00,false);
  }
  return str_local;
}

Assistant:

char*
blogc_htmlentities(const char *str)
{
    if (str == NULL)
        return NULL;
    bc_string_t *rv = bc_string_new();
    for (size_t i = 0; str[i] != '\0'; i++)
        htmlentities_append(rv, str[i]);
    return bc_string_free(rv, false);
}